

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int mbedtls_x509write_crt_der
              (mbedtls_x509write_cert *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t oid_len;
  long lVar7;
  long lVar8;
  ulong ilen;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_type_t local_cd4;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  size_t sig_len;
  size_t sig_and_oid_len;
  size_t pub_len;
  size_t sub_len;
  uchar tmp_buf [2048];
  uchar sig [1024];
  uchar hash [64];
  _func_int_void_ptr_uchar_ptr_size_t *local_60;
  uchar *c2;
  uchar *c;
  size_t sig_oid_len;
  char *sig_oid;
  void *pvStack_38;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  uchar *buf_local;
  mbedtls_x509write_cert *ctx_local;
  
  c = (uchar *)0x0;
  pub_len = 0;
  sig_and_oid_len = 0;
  sig_len = 0;
  c2 = tmp_buf + 0x7f8;
  pvStack_38 = p_rng;
  p_rng_local = f_rng;
  f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)size;
  size_local = (size_t)buf;
  buf_local = (uchar *)ctx;
  local_cd4 = mbedtls_pk_get_type(ctx->issuer_key);
  if (local_cd4 == MBEDTLS_PK_ECKEY) {
    local_cd4 = MBEDTLS_PK_ECDSA;
  }
  sig_oid._4_4_ =
       mbedtls_oid_get_oid_by_sig_alg
                 (local_cd4,*(mbedtls_md_type_t *)(buf_local + 0x40),(char **)&sig_oid_len,
                  (size_t *)&c);
  ctx_local._4_4_ = sig_oid._4_4_;
  if ((sig_oid._4_4_ == 0) &&
     (sig_oid._4_4_ =
           mbedtls_x509_write_extensions
                     (&c2,(uchar *)&sub_len,*(mbedtls_asn1_named_data **)(buf_local + 0x68)),
     ctx_local._4_4_ = sig_oid._4_4_, -1 < sig_oid._4_4_)) {
    sVar2 = (size_t)sig_oid._4_4_;
    sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&sub_len,sVar2);
    ctx_local._4_4_ = sig_oid._4_4_;
    if (-1 < sig_oid._4_4_) {
      lVar3 = (long)sig_oid._4_4_;
      sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&sub_len,'0');
      ctx_local._4_4_ = sig_oid._4_4_;
      if (-1 < sig_oid._4_4_) {
        sVar2 = (long)sig_oid._4_4_ + lVar3 + sVar2;
        sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&sub_len,sVar2);
        ctx_local._4_4_ = sig_oid._4_4_;
        if (-1 < sig_oid._4_4_) {
          lVar3 = (long)sig_oid._4_4_;
          sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&sub_len,0xa3);
          ctx_local._4_4_ = sig_oid._4_4_;
          if (-1 < sig_oid._4_4_) {
            lVar4 = (long)sig_oid._4_4_;
            sig_oid._4_4_ =
                 mbedtls_pk_write_pubkey_der
                           (*(mbedtls_pk_context **)(buf_local + 0x20),(uchar *)&sub_len,
                            (long)c2 - (long)&sub_len);
            ctx_local._4_4_ = sig_oid._4_4_;
            if (-1 < sig_oid._4_4_) {
              sig_and_oid_len = (long)sig_oid._4_4_ + sig_and_oid_len;
              c2 = c2 + -sig_and_oid_len;
              lVar3 = sig_and_oid_len + lVar4 + lVar3 + sVar2;
              sig_oid._4_4_ =
                   mbedtls_x509_write_names
                             (&c2,(uchar *)&sub_len,*(mbedtls_asn1_named_data **)(buf_local + 0x30))
              ;
              ctx_local._4_4_ = sig_oid._4_4_;
              if (-1 < sig_oid._4_4_) {
                lVar4 = (long)sig_oid._4_4_;
                pub_len = 0;
                sig_oid._4_4_ =
                     x509_write_time(&c2,(uchar *)&sub_len,(char *)(buf_local + 0x54),0xf);
                ctx_local._4_4_ = sig_oid._4_4_;
                if (-1 < sig_oid._4_4_) {
                  pub_len = (long)sig_oid._4_4_ + pub_len;
                  sig_oid._4_4_ =
                       x509_write_time(&c2,(uchar *)&sub_len,(char *)(buf_local + 0x44),0xf);
                  ctx_local._4_4_ = sig_oid._4_4_;
                  if (-1 < sig_oid._4_4_) {
                    pub_len = (long)sig_oid._4_4_ + pub_len;
                    lVar3 = pub_len + lVar4 + lVar3;
                    sig_oid._4_4_ = mbedtls_asn1_write_len(&c2,(uchar *)&sub_len,pub_len);
                    ctx_local._4_4_ = sig_oid._4_4_;
                    if (-1 < sig_oid._4_4_) {
                      lVar4 = (long)sig_oid._4_4_;
                      sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&sub_len,'0');
                      ctx_local._4_4_ = sig_oid._4_4_;
                      if (-1 < sig_oid._4_4_) {
                        lVar5 = (long)sig_oid._4_4_;
                        sig_oid._4_4_ =
                             mbedtls_x509_write_names
                                       (&c2,(uchar *)&sub_len,
                                        *(mbedtls_asn1_named_data **)(buf_local + 0x38));
                        sVar2 = sig_oid_len;
                        ctx_local._4_4_ = sig_oid._4_4_;
                        if (-1 < sig_oid._4_4_) {
                          lVar6 = (long)sig_oid._4_4_;
                          oid_len = strlen((char *)sig_oid_len);
                          sig_oid._4_4_ =
                               mbedtls_asn1_write_algorithm_identifier
                                         (&c2,(uchar *)&sub_len,(char *)sVar2,oid_len,0);
                          ctx_local._4_4_ = sig_oid._4_4_;
                          if (-1 < sig_oid._4_4_) {
                            lVar7 = (long)sig_oid._4_4_;
                            sig_oid._4_4_ =
                                 mbedtls_asn1_write_mpi
                                           (&c2,(uchar *)&sub_len,(mbedtls_mpi *)(buf_local + 8));
                            ctx_local._4_4_ = sig_oid._4_4_;
                            if (-1 < sig_oid._4_4_) {
                              lVar8 = (long)sig_oid._4_4_;
                              pub_len = 0;
                              sig_oid._4_4_ =
                                   mbedtls_asn1_write_int(&c2,(uchar *)&sub_len,*(int *)buf_local);
                              ctx_local._4_4_ = sig_oid._4_4_;
                              if (-1 < sig_oid._4_4_) {
                                pub_len = (long)sig_oid._4_4_ + pub_len;
                                lVar3 = pub_len + lVar8 + lVar7 + lVar6 + lVar5 + lVar4 + lVar3;
                                sig_oid._4_4_ =
                                     mbedtls_asn1_write_len(&c2,(uchar *)&sub_len,pub_len);
                                ctx_local._4_4_ = sig_oid._4_4_;
                                if (-1 < sig_oid._4_4_) {
                                  lVar4 = (long)sig_oid._4_4_;
                                  sig_oid._4_4_ = mbedtls_asn1_write_tag(&c2,(uchar *)&sub_len,0xa0)
                                  ;
                                  ctx_local._4_4_ = sig_oid._4_4_;
                                  if (-1 < sig_oid._4_4_) {
                                    sVar2 = (long)sig_oid._4_4_ + lVar4 + lVar3;
                                    sig_oid._4_4_ =
                                         mbedtls_asn1_write_len(&c2,(uchar *)&sub_len,sVar2);
                                    ctx_local._4_4_ = sig_oid._4_4_;
                                    if (-1 < sig_oid._4_4_) {
                                      lVar3 = (long)sig_oid._4_4_;
                                      sig_oid._4_4_ =
                                           mbedtls_asn1_write_tag(&c2,(uchar *)&sub_len,'0');
                                      ctx_local._4_4_ = sig_oid._4_4_;
                                      if (-1 < sig_oid._4_4_) {
                                        ilen = (long)sig_oid._4_4_ + lVar3 + sVar2;
                                        md_info = mbedtls_md_info_from_type
                                                            (*(mbedtls_md_type_t *)
                                                              (buf_local + 0x40));
                                        mbedtls_md(md_info,c2,ilen,sig + 0x3f8);
                                        sig_oid._4_4_ =
                                             mbedtls_pk_sign(*(mbedtls_pk_context **)
                                                              (buf_local + 0x28),
                                                             *(mbedtls_md_type_t *)
                                                              (buf_local + 0x40),sig + 0x3f8,0,
                                                             tmp_buf + 0x7f8,&len,
                                                             (_func_int_void_ptr_uchar_ptr_size_t *)
                                                             p_rng_local,pvStack_38);
                                        ctx_local._4_4_ = sig_oid._4_4_;
                                        if (sig_oid._4_4_ == 0) {
                                          local_60 = f_rng_local + size_local;
                                          sig_oid._4_4_ =
                                               mbedtls_x509_write_sig
                                                         ((uchar **)&local_60,(uchar *)size_local,
                                                          (char *)sig_oid_len,(size_t)c,
                                                          tmp_buf + 0x7f8,len);
                                          ctx_local._4_4_ = sig_oid._4_4_;
                                          if (-1 < sig_oid._4_4_) {
                                            sig_len = (long)sig_oid._4_4_ + sig_len;
                                            if ((long)local_60 - size_local < ilen) {
                                              ctx_local._4_4_ = -0x6c;
                                            }
                                            else {
                                              local_60 = local_60 + -ilen;
                                              memcpy(local_60,c2,ilen);
                                              sVar2 = sig_len + ilen;
                                              sig_oid._4_4_ =
                                                   mbedtls_asn1_write_len
                                                             ((uchar **)&local_60,
                                                              (uchar *)size_local,sVar2);
                                              ctx_local._4_4_ = sig_oid._4_4_;
                                              if (-1 < sig_oid._4_4_) {
                                                iVar1 = sig_oid._4_4_ + (int)sVar2;
                                                ctx_local._4_4_ =
                                                     mbedtls_asn1_write_tag
                                                               ((uchar **)&local_60,
                                                                (uchar *)size_local,'0');
                                                if (-1 < ctx_local._4_4_) {
                                                  ctx_local._4_4_ = ctx_local._4_4_ + iVar1;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_crt_der( mbedtls_x509write_cert *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    const char *sig_oid;
    size_t sig_oid_len = 0;
    unsigned char *c, *c2;
    unsigned char hash[64];
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char tmp_buf[2048];
    size_t sub_len = 0, pub_len = 0, sig_and_oid_len = 0, sig_len;
    size_t len = 0;
    mbedtls_pk_type_t pk_alg;

    /*
     * Prepare data to be signed in tmp_buf
     */
    c = tmp_buf + sizeof( tmp_buf );

    /* Signature algorithm needed in TBS, and later for actual signature */
    pk_alg = mbedtls_pk_get_type( ctx->issuer_key );
    if( pk_alg == MBEDTLS_PK_ECKEY )
        pk_alg = MBEDTLS_PK_ECDSA;

    if( ( ret = mbedtls_oid_get_oid_by_sig_alg( pk_alg, ctx->md_alg,
                                        &sig_oid, &sig_oid_len ) ) != 0 )
    {
        return( ret );
    }

    /*
     *  Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_extensions( &c, tmp_buf, ctx->extensions ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC |
                                                    MBEDTLS_ASN1_CONSTRUCTED | 3 ) );

    /*
     *  SubjectPublicKeyInfo
     */
    MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_pk_write_pubkey_der( ctx->subject_key,
                                                tmp_buf, c - tmp_buf ) );
    c -= pub_len;
    len += pub_len;

    /*
     *  Subject  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->subject ) );

    /*
     *  Validity ::= SEQUENCE {
     *       notBefore      Time,
     *       notAfter       Time }
     */
    sub_len = 0;

    MBEDTLS_ASN1_CHK_ADD( sub_len, x509_write_time( &c, tmp_buf, ctx->not_after,
                                            MBEDTLS_X509_RFC5280_UTC_TIME_LEN ) );

    MBEDTLS_ASN1_CHK_ADD( sub_len, x509_write_time( &c, tmp_buf, ctx->not_before,
                                            MBEDTLS_X509_RFC5280_UTC_TIME_LEN ) );

    len += sub_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, sub_len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     *  Issuer  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->issuer ) );

    /*
     *  Signature   ::=  AlgorithmIdentifier
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, tmp_buf,
                       sig_oid, strlen( sig_oid ), 0 ) );

    /*
     *  Serial   ::=  INTEGER
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, tmp_buf, &ctx->serial ) );

    /*
     *  Version  ::=  INTEGER  {  v1(0), v2(1), v3(2)  }
     */
    sub_len = 0;
    MBEDTLS_ASN1_CHK_ADD( sub_len, mbedtls_asn1_write_int( &c, tmp_buf, ctx->version ) );
    len += sub_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, sub_len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC |
                                                    MBEDTLS_ASN1_CONSTRUCTED | 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     * Make signature
     */
    mbedtls_md( mbedtls_md_info_from_type( ctx->md_alg ), c, len, hash );

    if( ( ret = mbedtls_pk_sign( ctx->issuer_key, ctx->md_alg, hash, 0, sig, &sig_len,
                         f_rng, p_rng ) ) != 0 )
    {
        return( ret );
    }

    /*
     * Write data to output buffer
     */
    c2 = buf + size;
    MBEDTLS_ASN1_CHK_ADD( sig_and_oid_len, mbedtls_x509_write_sig( &c2, buf,
                                        sig_oid, sig_oid_len, sig, sig_len ) );

    if( len > (size_t)( c2 - buf ) )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    c2 -= len;
    memcpy( c2, c, len );

    len += sig_and_oid_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c2, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c2, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}